

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrppm.c
# Opt level: O0

void put_demapped_rgb(j_decompress_ptr cinfo,djpeg_dest_ptr dinfo,JDIMENSION rows_supplied)

{
  long lVar1;
  long lVar2;
  long lVar3;
  uint uVar4;
  undefined1 *puVar5;
  long in_RSI;
  long in_RDI;
  JDIMENSION col;
  JSAMPROW color_map2;
  JSAMPROW color_map1;
  JSAMPROW color_map0;
  JSAMPROW ptr;
  int pixval;
  char *bufferptr;
  ppm_dest_ptr dest;
  int local_54;
  byte *local_38;
  undefined1 *local_28;
  
  lVar1 = **(long **)(in_RDI + 0xa0);
  lVar2 = *(long *)(*(long *)(in_RDI + 0xa0) + 8);
  lVar3 = *(long *)(*(long *)(in_RDI + 0xa0) + 0x10);
  local_28 = *(undefined1 **)(in_RSI + 0x38);
  local_38 = (byte *)**(undefined8 **)(in_RSI + 0x28);
  for (local_54 = *(int *)(in_RDI + 0x88); local_54 != 0; local_54 = local_54 + -1) {
    uVar4 = (uint)*local_38;
    *local_28 = *(undefined1 *)(lVar1 + (int)uVar4);
    puVar5 = local_28 + 2;
    local_28[1] = *(undefined1 *)(lVar2 + (int)uVar4);
    local_28 = local_28 + 3;
    *puVar5 = *(undefined1 *)(lVar3 + (int)uVar4);
    local_38 = local_38 + 1;
  }
  fwrite(*(void **)(in_RSI + 0x38),1,*(size_t *)(in_RSI + 0x48),*(FILE **)(in_RSI + 0x20));
  return;
}

Assistant:

METHODDEF(void)
put_demapped_rgb(j_decompress_ptr cinfo, djpeg_dest_ptr dinfo,
                 JDIMENSION rows_supplied)
{
  ppm_dest_ptr dest = (ppm_dest_ptr)dinfo;
  register char *bufferptr;
  register int pixval;
  register JSAMPROW ptr;
  register JSAMPROW color_map0 = cinfo->colormap[0];
  register JSAMPROW color_map1 = cinfo->colormap[1];
  register JSAMPROW color_map2 = cinfo->colormap[2];
  register JDIMENSION col;

  ptr = dest->pub.buffer[0];
  bufferptr = dest->iobuffer;
  for (col = cinfo->output_width; col > 0; col--) {
    pixval = *ptr++;
    PUTPPMSAMPLE(bufferptr, color_map0[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map1[pixval]);
    PUTPPMSAMPLE(bufferptr, color_map2[pixval]);
  }
  (void)JFWRITE(dest->pub.output_file, dest->iobuffer, dest->buffer_width);
}